

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O2

bool __thiscall
slang::ast::Expression::isImplicitlyAssignableTo
          (Expression *this,Compilation *compilation,Type *targetType)

{
  bool bVar1;
  
  bVar1 = Type::isAssignmentCompatible(targetType,(this->type).ptr);
  if (bVar1) {
    return true;
  }
  bVar1 = Type::isString(targetType);
  if (((bVar1) || (bVar1 = Type::isByteArray(targetType), bVar1)) &&
     (bVar1 = isImplicitString(this), bVar1)) {
    return true;
  }
  bVar1 = Type::isEnum(targetType);
  if (bVar1) {
    bVar1 = anon_unknown.dwarf_16d23b0::isSameEnum(this,targetType);
    if (bVar1) {
      return true;
    }
    bVar1 = Type::isIntegral((this->type).ptr);
    if (bVar1) {
      return (bool)(((byte)(compilation->options).flags.m_bits & 2) >> 1);
    }
  }
  else {
    bVar1 = Type::isString((this->type).ptr);
    if (((bVar1) && (bVar1 = Type::isIntegral(targetType), bVar1)) &&
       (((compilation->options).flags.m_bits & 0x100) != 0)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Expression::isImplicitlyAssignableTo(Compilation& compilation, const Type& targetType) const {
    if (targetType.isAssignmentCompatible(*type))
        return true;

    // String literals have a type of integer, but are allowed to implicitly convert to the
    // string type.
    if ((targetType.isString() || targetType.isByteArray()) && isImplicitString())
        return true;

    if (targetType.isEnum()) {
        return isSameEnum(*this, targetType) ||
               (type->isIntegral() && compilation.hasFlag(CompilationFlags::RelaxEnumConversions));
    }

    if (type->isString() && targetType.isIntegral() &&
        compilation.hasFlag(CompilationFlags::RelaxStringConversions)) {
        return true;
    }

    return false;
}